

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

void compute_ui_entry_values_for_player
               (ui_entry *entry,player *p,cached_player_data **cache,int *val,int *auxval)

{
  bitflag *flags;
  char cVar1;
  ushort uVar2;
  short sVar3;
  char *__s1;
  loc grid;
  bound_object_property *pbVar4;
  short *psVar5;
  wchar_t wVar6;
  bool bVar7;
  ui_entry_combiner_funcs_conflict *puVar8;
  _Bool _Var9;
  _Bool _Var10;
  bool bVar11;
  int iVar12;
  wchar_t wVar13;
  cached_player_data *f;
  int *piVar14;
  object *poVar15;
  bound_player_ability *pbVar16;
  long lVar17;
  long lVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  _Bool _Var21;
  uint uVar22;
  bool bVar23;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  int *local_40;
  
  cst.work = (void *)0x0;
  cst.accum = L'\0';
  cst.accum_aux = L'\0';
  if (p == (player *)0x0) {
    *val = 0x7ffffffe;
    cst.accum_aux = L'\x7ffffffe';
  }
  else {
    if (*cache == (cached_player_data *)0x0) {
      f = (cached_player_data *)mem_alloc(0xc);
      *cache = f;
      player_flags(p,(bitflag *)f);
      flag_wipe((*cache)->timed,6);
      player_flags_timed(p,(*cache)->timed);
      if (p->timed[0x20] != 0) {
        flag_on_dbg((*cache)->timed,6,0x28,"(*cache)->timed","OF_TRAP_IMMUNE");
      }
    }
    iVar12 = ui_entry_combiner_get_funcs(entry->combiner_index,(ui_entry_combiner_funcs *)&combiner)
    ;
    if (iVar12 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x375,
                    "void compute_ui_entry_values_for_player(const struct ui_entry *, struct player *, struct cached_player_data **, int *, int *)"
                   );
    }
    flags = (p->state).pflags;
    bVar7 = true;
    local_40 = &timed_effects[0].temp_resist;
    bVar11 = false;
    for (lVar18 = 0; lVar18 < entry->n_p_ability; lVar18 = lVar18 + 1) {
      pbVar16 = entry->p_abilities;
      uVar2 = (pbVar16[lVar18].ability)->index;
      wVar19 = entry->flags;
      if (((wVar19 & 1U) != 0) && (pbVar16[lVar18].isaux != false)) goto LAB_001d3f33;
      __s1 = (pbVar16[lVar18].ability)->type;
      iVar12 = strcmp(__s1,"player");
      uVar22 = (uint)uVar2;
      if (iVar12 == 0) {
        _Var10 = flag_has_dbg(flags,10,(uint)uVar2,"p->state.pflags","(ind)");
        if (!_Var10) goto LAB_001d3f33;
        pbVar16 = entry->p_abilities;
        if (pbVar16[lVar18].have_value == true) {
          wVar19 = pbVar16[lVar18].value;
          wVar20 = L'\x7ffffffe';
          if (pbVar16[lVar18].isaux != false) {
            wVar19 = L'\x7ffffffe';
            wVar20 = pbVar16[lVar18].value;
          }
        }
        else {
          if (uVar2 != 0x12) {
            if (uVar2 == 0x13) {
              wVar19 = slot_by_name(p,"weapon");
              poVar15 = slot_object(p,wVar19);
              wVar19 = L'\0';
              if (poVar15 == (object *)0x0) {
                wVar19 = (wchar_t)(p->lev / 2);
              }
              pbVar16 = entry->p_abilities;
LAB_001d3e6c:
              cVar1 = pbVar16[lVar18].isaux;
LAB_001d3e83:
              wVar20 = L'\0';
              if (cVar1 != '\0') {
                wVar20 = wVar19;
              }
              if (cVar1 != '\0') {
                wVar19 = L'\0';
              }
            }
            else {
              if (uVar2 == 0x19) {
                wVar19 = (wchar_t)(0x1d < p->lev);
                cVar1 = pbVar16[lVar18].isaux;
                goto LAB_001d3e83;
              }
              if (uVar22 == 0x4a) {
LAB_001d3d76:
                if (p->speed_boost == 0) {
                  wVar19 = L'\0';
                }
                else {
                  wVar19 = (p->speed_boost + 5) / 10;
                }
                bVar23 = pbVar16[lVar18].isaux != false;
                wVar20 = L'\0';
                if (bVar23) {
                  wVar20 = wVar19;
                }
                if (bVar23) {
                  wVar19 = L'\0';
                }
                goto joined_r0x001d3f07;
              }
              if (uVar22 == 0x2e) {
                wVar19 = L'\0';
                if (0x23 < p->lev) {
                  _Var10 = flag_has_dbg(flags,10,0x2d,"p->state.pflags","(PF_STRONG_MAGIC)");
                  wVar19 = L'\x01';
                  if (!_Var10) {
                    wVar19 = (wchar_t)(0x2d < p->lev);
                  }
                }
LAB_001d3e2d:
                pbVar16 = entry->p_abilities;
                goto LAB_001d3e6c;
              }
              if (uVar22 == 0x30) {
                if ((character_dungeon == true) &&
                   (_Var10 = flag_has_dbg(flags,10,0x16,"p->state.pflags","(PF_ELVEN)"), _Var10)) {
                  grid.x = (p->grid).x;
                  grid.y = (p->grid).y;
                  _Var10 = square_istree(cave,grid);
                  wVar19 = L'\x03';
                  if (_Var10) goto LAB_001d3e2d;
                }
                wVar19 = L'\0';
                goto LAB_001d3e2d;
              }
              if (uVar22 == 0x37) goto LAB_001d3d76;
              if (uVar22 != 0x25) goto LAB_001d3f33;
              poVar15 = equipped_item_by_slot_name(p,"shooting");
              wVar19 = L'\0';
              if ((poVar15 != (object *)0x0) &&
                 (_Var10 = flag_has_dbg(poVar15->kind->kind_flags,4,0x19,
                                        "launcher->kind->kind_flags","KF_SHOOTS_ARROWS"),
                 wVar19 = L'\0', _Var10)) {
                wVar19 = (wchar_t)(p->lev / 3);
              }
              bVar23 = entry->p_abilities[lVar18].isaux != false;
              wVar20 = L'\0';
              if (bVar23) {
                wVar20 = wVar19;
              }
              if (bVar23) {
                wVar19 = L'\0';
              }
            }
            if (!bVar7) goto LAB_001d3f20;
            (*combiner.init_func)(wVar19,wVar20,&cst);
            bVar7 = false;
            goto LAB_001d3f33;
          }
          _Var10 = player_of_has(p,L'\x1e');
          if (!_Var10) goto LAB_001d3f33;
          _Var10 = entry->p_abilities[lVar18].isaux;
          wVar19 = (uint)_Var10 + (uint)_Var10 * 2 + L'\xfffffffd';
          wVar20 = (uint)(_Var10 ^ 1U) + (uint)(_Var10 ^ 1U) * 2 + L'\xfffffffd';
        }
joined_r0x001d3f07:
        if (bVar7) {
          (*combiner.init_func)(wVar19,wVar20,&cst);
          bVar7 = false;
        }
        else {
          (*combiner.accum_func)(wVar19,wVar20,&cst);
        }
      }
      else {
        iVar12 = strcmp(__s1,"object");
        if (iVar12 == 0) {
          _Var9 = flag_has_dbg((*cache)->untimed,6,(uint)uVar2,"(*cache)->untimed","ind");
          _Var10 = false;
          if ((entry->flags & L'\x01') != L'\0') {
            _Var10 = flag_has_dbg((*cache)->timed,6,(uint)uVar2,"(*cache)->timed","ind");
          }
          _Var21 = _Var9;
          if (entry->p_abilities[lVar18].isaux != false) {
            _Var21 = _Var10;
            _Var10 = _Var9;
          }
          puVar8 = (ui_entry_combiner_funcs_conflict *)&combiner.accum_func;
          if (bVar7) {
            bVar7 = false;
            puVar8 = &combiner;
          }
          (*puVar8->init_func)(SUB14(_Var21,0),SUB14(_Var10,0),&cst);
          _Var10 = flag_has_dbg(p->shape->flags,6,(uint)uVar2,"p->shape->flags","ind");
          if ((_Var10) &&
             (_Var9 = flag_has_dbg(p->obj_k->flags,6,(uint)uVar2,"p->obj_k->flags","ind"), _Var9)) {
            bVar23 = entry->p_abilities[lVar18].isaux != false;
            _Var9 = false;
            if (bVar23) {
              _Var9 = _Var10;
            }
            if (bVar23) {
              _Var10 = false;
            }
            (*combiner.accum_func)(SUB14(_Var10,0),SUB14(_Var9,0),&cst);
          }
        }
        else {
          iVar12 = strcmp(__s1,"element");
          if (iVar12 == 0 && !bVar11) {
            wVar20 = L'd';
            if ((wVar19 & 1U) != 0) {
              piVar14 = local_40;
              for (lVar17 = 0; lVar17 != 0x35; lVar17 = lVar17 + 1) {
                if ((p->timed[lVar17] != 0) && (*piVar14 == uVar22)) {
                  wVar20 = L'<';
                  goto LAB_001d3ce1;
                }
                piVar14 = piVar14 + 0x1e;
              }
              wVar20 = L'd';
            }
LAB_001d3ce1:
            wVar13 = (wchar_t)p->race->el_info[uVar2].res_level;
            wVar19 = wVar20;
            if (pbVar16[lVar18].isaux != false) {
              wVar19 = wVar13;
              wVar13 = wVar20;
            }
            puVar8 = (ui_entry_combiner_funcs_conflict *)&combiner.accum_func;
            if (bVar7) {
              bVar7 = false;
              puVar8 = &combiner;
            }
            (*puVar8->init_func)(wVar13,wVar19,&cst);
            wVar19 = (wchar_t)p->shape->el_info[uVar2].res_level;
            bVar11 = true;
            if ((wVar19 != L'd') && (p->obj_k->el_info[uVar2].res_level != 0)) {
              if (entry->p_abilities[lVar18].isaux == false) {
                wVar20 = L'd';
              }
              else {
                wVar20 = wVar19;
                wVar19 = L'd';
              }
LAB_001d3f20:
              (*combiner.accum_func)(wVar19,wVar20,&cst);
            }
          }
        }
      }
LAB_001d3f33:
    }
    lVar17 = 0;
    for (lVar18 = 0; lVar18 < entry->n_obj_prop; lVar18 = lVar18 + 1) {
      pbVar4 = entry->obj_props;
      iVar12 = *(int *)((long)&pbVar4->index + lVar17);
      if ((((&pbVar4->isaux)[lVar17] == true) && ((entry->flags & L'\x01') != L'\0')) ||
         (1 < *(int *)((long)&pbVar4->type + lVar17) - 1U)) goto LAB_001d40e7;
      wVar20 = (wchar_t)p->shape->modifiers[iVar12];
      wVar19 = L'\0';
      if ((entry->flags & L'\x01') == L'\0') goto LAB_001d4054;
      _Var10 = flag_has_dbg(flags,10,0x42,"p->state.pflags","(PF_ENHANCE_MAGIC)");
      if (5 < iVar12 - 5U) goto switchD_001d3fde_caseD_6;
      switch(iVar12) {
      case 5:
        sVar3 = p->timed[0x33];
        wVar19 = (uint)_Var10 * 3 + L'\n';
        goto LAB_001d4046;
      default:
        goto switchD_001d3fde_caseD_6;
      case 7:
        sVar3 = p->timed[0x12];
        wVar19 = (uint)_Var10 * 3 + L'\x05';
LAB_001d4046:
        if (sVar3 == 0) {
          wVar19 = L'\0';
        }
switchD_001d3fde_caseD_6:
        break;
      case 9:
        psVar5 = p->timed;
        if ((*psVar5 == 0) && (psVar5[0x1d] == 0)) {
          wVar19 = L'\0';
        }
        else {
          wVar19 = (uint)_Var10 + (uint)_Var10 * 2 + L'\n';
        }
        wVar13 = wVar19 + L'\xfffffffb';
        if (psVar5[0x1b] == 0) {
          wVar13 = wVar19;
        }
        wVar6 = wVar13 + L'\xfffffff6';
        if (psVar5[1] == 0) {
          wVar6 = wVar13;
        }
        wVar19 = wVar6 + L'\n';
        if (psVar5[0x1c] == 0) {
          wVar19 = wVar6;
        }
        break;
      case 10:
        if (p->timed[0x31] != 0) {
          wVar19 = (int)(p->timed[0x31] / 0x14);
        }
      }
LAB_001d4054:
      wVar13 = wVar19;
      if ((&entry->obj_props->isaux)[lVar17] != false) {
        wVar13 = wVar20;
        wVar20 = wVar19;
      }
      puVar8 = (ui_entry_combiner_funcs_conflict *)&combiner.accum_func;
      if (bVar7) {
        bVar7 = false;
        puVar8 = &combiner;
      }
      (*puVar8->init_func)(wVar20,wVar13,&cst);
      if (iVar12 == 7) {
        wVar19 = p->race->infra;
LAB_001d40bd:
        wVar20 = L'\0';
        if ((&entry->obj_props->isaux)[lVar17] != false) {
          wVar20 = wVar19;
          wVar19 = L'\0';
        }
        (*combiner.accum_func)(wVar19,wVar20,&cst);
      }
      else if (iVar12 == 8) {
        wVar19 = p->race->r_skills[9] / 0x14;
        goto LAB_001d40bd;
      }
LAB_001d40e7:
      lVar17 = lVar17 + 0x10;
    }
    if (bVar7) {
      *val = 0x7ffffffe;
      cst.accum_aux = L'\x7ffffffe';
    }
    else {
      (*combiner.finish_func)(&cst);
      *val = cst.accum;
    }
  }
  *auxval = cst.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_player(const struct ui_entry *entry,
	struct player *p, struct cached_player_data **cache, int *val,
	int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	bool first, element_done = false;
	int i;

	if (!p) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		player_flags(p, (*cache)->untimed);
		of_wipe((*cache)->timed);
		player_flags_timed(p, (*cache)->timed);
		if (p->timed[TMD_TRAPSAFE]) {
			of_on((*cache)->timed, OF_TRAP_IMMUNE);
		}
	}
	first = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < entry->n_p_ability; ++i) {
		int ind = entry->p_abilities[i].ability->index;

		if ((entry->flags & ENTRY_FLAG_TIMED_AUX) &&
			entry->p_abilities[i].isaux) {
			continue;
		}
		if (streq(entry->p_abilities[i].ability->type, "player")) {
			if (! player_has(p, ind)) {
				continue;
			}
			if (entry->p_abilities[i].have_value) {
				int v = entry->p_abilities[i].value;
				int a = UI_ENTRY_VALUE_NOT_PRESENT;

				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				if (first) {
					(*combiner.init_func)(v, a, &cst);
					first = false;
				} else {
					(*combiner.accum_func)(v, a, &cst);
				}
			} else {
				int v, a;
				struct object *launcher;

				/*
				 * Handle player abilities that did not bind a
				 * value to the user interface element as
				 * special cases.
				 */
				switch (ind) {
				case PF_BOW_SPEED_GREAT:
					launcher = equipped_item_by_slot_name(
						p, "shooting");
					if (launcher && kf_has(launcher->kind->kind_flags,
						KF_SHOOTS_ARROWS)) {
						v = p->lev / 3;
						a = 0;
					} else {
						v = 0;
						a = 0;
					}
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_BRAVERY_30:
					/*
					 * player_flags() accounts for
					 * PF_BRAVERY_30 so this is only
					 * necessary in cases where
					 * OF_PROT_FEAR isn't also bound to
					 * the element.
					 */
					v = (p->lev >= 30) ? 1 : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_FURY:
				case PF_PHASEWALK:
					v = (p->speed_boost) ?
						 ((p->speed_boost + 5) / 10) : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_HOLY:
					if ((p->lev > 35 &&
						player_has(p, PF_STRONG_MAGIC)) ||
						p->lev > 45) {
						v = 1;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_SHADOW:
					if (player_of_has(p, OF_AGGRAVATE)) {
						v = -3;
						a = 0;
						if (entry->p_abilities[i].isaux) {
							int t = v;

							v = a;
							a = t;
						}
						if (first) {
							(*combiner.init_func)(v, a, &cst);
							first = false;
						} else {
							(*combiner.accum_func)(v, a, &cst);
						}
					};
					break;

				case PF_WOODEN:
					/* Account for unarmed digging bonus. */
					if (! slot_object(p, slot_by_name(p, "weapon"))) {
						v = p->lev / 2;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_WOODSMAN:
					if (character_dungeon &&
						player_has(p, PF_ELVEN) &&
						square_istree(cave, p->grid)) {
						v = 3;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;
				}
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"object")) {
			int v = of_has((*cache)->untimed, ind) ? 1 : 0;
			int a;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = of_has((*cache)->timed, ind) ? 1 : 0;
			} else {
				a = 0;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}

			v = of_has(p->shape->flags, ind) ? 1 : 0;
			a = 0;
			if (v && of_has(p->obj_k->flags, ind)) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"element") && !element_done) {
			int v = p->race->el_info[ind].res_level;
			int a;
			int base = RES_LEVEL_BASE;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_element_effect(p, ind);
			} else {
				a = base;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			v = p->shape->el_info[ind].res_level;
			a = base;
			if (v != base && p->obj_k->el_info[ind].res_level) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			element_done = true;
		}
	}
	/*
	 * Since stats and modifiers aren't stored in the ability list, check
	 * if any object properties for those are bound to this element.
	 * Then lookup the player's intrinsic values for those.
	 */
	for (i = 0; i < entry->n_obj_prop; ++i) {
		int ind = entry->obj_props[i].index;
		int skill_ind, skill_cnv_num, skill_cnv_den;
		int v, a;

		if (entry->obj_props[i].isaux &&
			(entry->flags & ENTRY_FLAG_TIMED_AUX)) {
			continue;
		}
		switch (entry->obj_props[i].type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
			v = p->shape->modifiers[ind];
			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_modifier_effect(p, ind);
			} else {
				a = 0;
			}
			if (entry->obj_props[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Racial information doesn't store modifiers but does
			 * store skills.  If applicable, extract the relevant
			 * value and convert.
			 */
			modifier_to_skill(ind, &skill_ind, &skill_cnv_num,
				&skill_cnv_den);
			if (skill_ind >= 0) {
				v = (p->race->r_skills[skill_ind] *
					skill_cnv_num) / skill_cnv_den;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Uggh, the player race handles infravision
			 * separately.
			 */
			if (ind == OBJ_MOD_INFRA) {
				v = p->race->infra;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			break;
		}
	}
	if (first) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
	} else {
		(*combiner.finish_func)(&cst);
		*val = cst.accum;
		*auxval = cst.accum_aux;
	}
}